

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adbc.cpp
# Opt level: O1

void __thiscall duckdb::ADBCTestDatabase::~ADBCTestDatabase(ADBCTestDatabase *this)

{
  _func_void_ArrowArrayStream_ptr *p_Var1;
  pointer pcVar2;
  char cVar3;
  AssertionHandler catchAssertionHandler;
  StringRef local_b8;
  AssertionHandler local_a8;
  SourceLineInfo local_60;
  StringRef local_50;
  StringRef local_40;
  
  p_Var1 = (this->arrow_stream).release;
  if (p_Var1 != (_func_void_ArrowArrayStream_ptr *)0x0) {
    (*p_Var1)(&this->arrow_stream);
    (this->arrow_stream).release = (_func_void_ArrowArrayStream_ptr *)0x0;
  }
  local_b8.m_start = "REQUIRE";
  local_b8.m_size = 7;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/adbc/test_adbc.cpp"
  ;
  local_60.line = 0x33;
  Catch::StringRef::StringRef
            (&local_40,"SUCCESS(AdbcConnectionRelease(&adbc_connection, &adbc_error))");
  Catch::AssertionHandler::AssertionHandler(&local_a8,&local_b8,&local_60,local_40,Normal);
  cVar3 = AdbcConnectionRelease(&this->adbc_connection,this);
  local_b8.m_start = (char *)CONCAT71(local_b8.m_start._1_7_,cVar3 == '\0');
  Catch::AssertionHandler::handleExpr<bool>(&local_a8,(ExprLhs<bool> *)&local_b8);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_b8.m_start = "REQUIRE";
  local_b8.m_size = 7;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/adbc/test_adbc.cpp"
  ;
  local_60.line = 0x34;
  Catch::StringRef::StringRef(&local_50,"SUCCESS(AdbcDatabaseRelease(&adbc_database, &adbc_error))")
  ;
  Catch::AssertionHandler::AssertionHandler(&local_a8,&local_b8,&local_60,local_50,Normal);
  cVar3 = AdbcDatabaseRelease(&this->adbc_database,this);
  local_b8.m_start = (char *)CONCAT71(local_b8.m_start._1_7_,cVar3 == '\0');
  Catch::AssertionHandler::handleExpr<bool>(&local_a8,(ExprLhs<bool> *)&local_b8);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  pcVar2 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->path).field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

~ADBCTestDatabase() {
		if (arrow_stream.release) {
			arrow_stream.release(&arrow_stream);
			arrow_stream.release = nullptr;
		}
		REQUIRE(SUCCESS(AdbcConnectionRelease(&adbc_connection, &adbc_error)));
		REQUIRE(SUCCESS(AdbcDatabaseRelease(&adbc_database, &adbc_error)));
	}